

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaCompareReplaceCollapseStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  bool bVar5;
  
  while (((ulong)*y < 0x21 && ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0))) {
    y = y + 1;
  }
  while( true ) {
    bVar1 = *x;
    uVar2 = (uint)bVar1;
    bVar3 = *y;
    if (uVar2 == 0) break;
    uVar4 = (uint)bVar3;
    if (uVar4 < 0x21) {
      if ((0x100002600U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        if ((ulong)uVar4 != 0) goto LAB_001cbc89;
      }
      else {
        if ((uVar2 < 0x21) && ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
          do {
            y = y + 1;
            if (0x20 < (ulong)*y) break;
          } while ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0);
          goto LAB_001cbca1;
        }
        if (bVar1 < 0x20) goto LAB_001cbcdf;
      }
LAB_001cbce6:
      bVar5 = invert != 0;
      goto LAB_001cbcea;
    }
LAB_001cbc89:
    if ((uVar2 < 0x21) && ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      if (bVar3 < 0x21) goto LAB_001cbce6;
      goto LAB_001cbcdf;
    }
    if (bVar1 < bVar3) {
      return -1;
    }
    if (bVar1 != bVar3) {
      return 1;
    }
    y = y + 1;
LAB_001cbca1:
    x = x + 1;
  }
  if (bVar3 == 0) {
    return 0;
  }
  do {
    y = y + 1;
    if (0x20 < bVar3) {
LAB_001cbcdf:
      bVar5 = invert == 0;
LAB_001cbcea:
      return -(uint)bVar5 | 1;
    }
    if ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0) {
      if ((ulong)bVar3 == 0) {
        return 0;
      }
      goto LAB_001cbcdf;
    }
    bVar3 = *y;
  } while( true );
}

Assistant:

static int
xmlSchemaCompareReplaceCollapseStrings(const xmlChar *x,
				       const xmlChar *y,
				       int invert)
{
    int tmp;

    /*
    * Skip leading blank chars of the collapsed string.
    */
    while IS_WSP_BLANK_CH(*y)
	y++;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_BLANK_CH(*x)) {
		/*
		* The yv character would have been replaced to 0x20.
		*/
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    x++;
	    y++;
	    /*
	    * Skip contiguous blank chars of the collapsed string.
	    */
	    while IS_WSP_BLANK_CH(*y)
		y++;
	} else {
	    if IS_WSP_BLANK_CH(*x) {
		/*
		* The xv character would have been replaced to 0x20.
		*/
		if ((0x20 - *y) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    tmp = *x++ - *y++;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
    }
    if (*x != 0) {
	 if (invert)
	     return(-1);
	 else
	     return(1);
    }
    if (*y != 0) {
	/*
	* Skip trailing blank chars of the collapsed string.
	*/
	while IS_WSP_BLANK_CH(*y)
	    y++;
	if (*y != 0) {
	    if (invert)
		return(1);
	    else
		return(-1);
	}
    }
    return(0);
}